

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

void lj_gc_finalize_cdata(lua_State *L)

{
  global_State *g;
  uint64_t uVar1;
  long lVar2;
  GCobj *o;
  ulong uVar3;
  uint64_t *puVar4;
  TValue tmp;
  cTValue local_38;
  
  g = (global_State *)(L->glref).ptr64;
  uVar1 = (g->ctype_state).ptr64;
  if (uVar1 != 0) {
    lVar2 = *(long *)(uVar1 + 0x20);
    *(undefined8 *)(lVar2 + 0x20) = 0;
    uVar3 = (ulong)*(uint *)(lVar2 + 0x34);
    puVar4 = (uint64_t *)(uVar3 * 0x18 + *(long *)(lVar2 + 0x28));
    for (; -1 < (long)uVar3; uVar3 = uVar3 - 1) {
      if ((*puVar4 != 0xffffffffffffffff) && ((uint)(puVar4[1] >> 0x2f) == 0x1fff5)) {
        o = (GCobj *)(puVar4[1] & 0x7fffffffffff);
        (o->gch).marked = (g->gc).currentwhite & 3 | (o->gch).marked & 0xe8;
        local_38.u64 = *puVar4;
        *puVar4 = 0xffffffffffffffff;
        gc_call_finalizer(g,L,&local_38,o);
      }
      puVar4 = puVar4 + -3;
    }
  }
  return;
}

Assistant:

void lj_gc_finalize_cdata(lua_State *L)
{
  global_State *g = G(L);
  CTState *cts = ctype_ctsG(g);
  if (cts) {
    GCtab *t = cts->finalizer;
    Node *node = noderef(t->node);
    ptrdiff_t i;
    setgcrefnull(t->metatable);  /* Mark finalizer table as disabled. */
    for (i = (ptrdiff_t)t->hmask; i >= 0; i--)
      if (!tvisnil(&node[i].val) && tviscdata(&node[i].key)) {
	GCobj *o = gcV(&node[i].key);
	TValue tmp;
	makewhite(g, o);
	o->gch.marked &= (uint8_t)~LJ_GC_CDATA_FIN;
	copyTV(L, &tmp, &node[i].val);
	setnilV(&node[i].val);
	gc_call_finalizer(g, L, &tmp, o);
      }
  }
}